

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CConnman::RecordBytesSent(CConnman *this,uint64_t bytes)

{
  long lVar1;
  strong_ordering sVar2;
  bool bVar3;
  duration<long,_std::ratio<1L,_1L>_> dVar4;
  type __rhs;
  long in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  duration<long,_std::ratio<1L,_1L>_> now;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock96;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff88;
  char *__lhs;
  char *pcVar5;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __lhs = "m_total_bytes_sent_mutex";
  pcVar5 = "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
  ;
  AssertLockNotHeldInline
            ((char *)in_stack_ffffffffffffff88,
             (char *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff7c,(Mutex *)0x211dc2);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffb8,
             (AnnotatedMixin<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
             ,in_RDI,(int)((ulong)pcVar5 >> 0x20),SUB81((ulong)pcVar5 >> 0x18,0));
  *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + in_RSI;
  dVar4 = GetTime<std::chrono::duration<long,std::ratio<1l,1l>>>();
  __rhs = std::chrono::operator+
                    (in_stack_ffffffffffffff88,
                     (duration<long,_std::ratio<1L,_1L>_> *)
                     CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<1L,_1L>_>
                    ((duration<long,_std::ratio<1L,_1L>_> *)__lhs,
                     (duration<long,_std::ratio<1L,_1L>_> *)__rhs.__r);
  std::__cmp_cat::__unspec::__unspec
            ((__unspec *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (__unspec *)0x211e68);
  bVar3 = std::operator<(sVar2._M_value);
  if (bVar3) {
    *(rep *)(in_RDI + 0x40) = dVar4.__r;
    in_RDI[0x38] = '\0';
    in_RDI[0x39] = '\0';
    in_RDI[0x3a] = '\0';
    in_RDI[0x3b] = '\0';
    in_RDI[0x3c] = '\0';
    in_RDI[0x3d] = '\0';
    in_RDI[0x3e] = '\0';
    in_RDI[0x3f] = '\0';
  }
  *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) + in_RSI;
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::RecordBytesSent(uint64_t bytes)
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);
    LOCK(m_total_bytes_sent_mutex);

    nTotalBytesSent += bytes;

    const auto now = GetTime<std::chrono::seconds>();
    if (nMaxOutboundCycleStartTime + MAX_UPLOAD_TIMEFRAME < now)
    {
        // timeframe expired, reset cycle
        nMaxOutboundCycleStartTime = now;
        nMaxOutboundTotalBytesSentInCycle = 0;
    }

    nMaxOutboundTotalBytesSentInCycle += bytes;
}